

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

Data2D<int> * __thiscall
TasGrid::GridWavelet::buildUpdateMap
          (Data2D<int> *__return_storage_ptr__,GridWavelet *this,double tolerance,
          TypeRefinement criteria,int output)

{
  int iVar1;
  AccelerationContext *acc;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t __n;
  reference pvVar5;
  int *piVar6;
  double *__first;
  int *piVar7;
  int *__result;
  Data2D<double> *pDVar8;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  int local_414;
  int local_3a4;
  int k_1;
  double *soeff;
  double *coeff;
  undefined1 local_388 [3];
  bool small_1;
  int i_2;
  MultiIndexSet local_370;
  undefined1 local_348 [8];
  GridWavelet direction_grid;
  double *vls;
  double *v;
  undefined1 local_140 [4];
  int i_1;
  Data2D<int> indexes;
  Data2D<double> vals;
  int active_outputs;
  int *pnts;
  int nump;
  int d;
  int s_1;
  SplitDirections split;
  int *p;
  size_t k;
  double *s;
  undefined1 local_78 [3];
  bool small;
  int i;
  vector<double,_std::allocator<double>_> norm;
  allocator<int> local_4d;
  uint local_4c;
  vector<int,_std::allocator<int>_> local_48;
  byte local_2d;
  int local_2c;
  int local_28;
  int num_points;
  int output_local;
  TypeRefinement criteria_local;
  double tolerance_local;
  GridWavelet *this_local;
  Data2D<int> *pmap;
  
  local_28 = output;
  num_points = criteria;
  _output_local = tolerance;
  tolerance_local = (double)this;
  this_local = (GridWavelet *)__return_storage_ptr__;
  iVar3 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  local_2d = 0;
  iVar4 = (this->super_BaseCanonicalGrid).num_dimensions;
  local_2c = iVar3;
  __n = Utils::size_mult<int,int>(iVar4,iVar3);
  local_4c = -(uint)(_output_local == 0.0) & 1;
  ::std::allocator<int>::allocator(&local_4d);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_48,__n,(value_type_conflict3 *)&local_4c,&local_4d);
  Data2D<int>::Data2D<int,int>(__return_storage_ptr__,iVar4,iVar3,&local_48);
  ::std::vector<int,_std::allocator<int>_>::~vector(&local_48);
  ::std::allocator<int>::~allocator(&local_4d);
  if ((_output_local != 0.0) || (NAN(_output_local))) {
    getNormalization((vector<double,_std::allocator<double>_> *)local_78,this);
    if ((num_points == 0) || (num_points == 1)) {
      for (s._4_4_ = 0; s._4_4_ < local_2c; s._4_4_ = s._4_4_ + 1) {
        bVar2 = true;
        pDVar8 = &this->coefficients;
        Data2D<double>::getStrip(pDVar8,s._4_4_);
        if (local_28 == -1) {
          for (p = (int *)0x0; p < (int *)(long)(this->super_BaseCanonicalGrid).num_outputs;
              p = (int *)((long)p + 1)) {
            if (bVar2) {
              ::std::abs((int)pDVar8);
              pDVar8 = (Data2D<double> *)local_78;
              pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)pDVar8,(size_type)p);
              if (_output_local < (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) / *pvVar5) {
                bVar2 = false;
              }
            }
          }
        }
        else {
          ::std::abs((int)pDVar8);
          pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_78,(long)local_28);
          bVar2 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) / *pvVar5 <=
                  _output_local;
        }
        if (!bVar2) {
          piVar6 = Data2D<int>::getStrip(__return_storage_ptr__,s._4_4_);
          split.job_pnts.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          ::std::fill<int*,int>
                    (piVar6,piVar6 + (this->super_BaseCanonicalGrid).num_dimensions,
                     (int *)((long)&split.job_pnts.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        }
      }
    }
    else {
      HierarchyManipulations::SplitDirections::SplitDirections
                ((SplitDirections *)&d,&(this->super_BaseCanonicalGrid).points);
      for (nump = 0;
          iVar4 = HierarchyManipulations::SplitDirections::getNumJobs((SplitDirections *)&d),
          nump < iVar4; nump = nump + 1) {
        iVar4 = HierarchyManipulations::SplitDirections::getJobDirection((SplitDirections *)&d,nump)
        ;
        iVar3 = HierarchyManipulations::SplitDirections::getJobNumPoints((SplitDirections *)&d,nump)
        ;
        piVar6 = HierarchyManipulations::SplitDirections::getJobPoints((SplitDirections *)&d,nump);
        if (local_28 == -1) {
          local_414 = (this->super_BaseCanonicalGrid).num_outputs;
        }
        else {
          local_414 = 1;
        }
        Data2D<double>::Data2D<int,int>
                  ((Data2D<double> *)
                   &indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_414,iVar3);
        Data2D<int>::Data2D<int,int>
                  ((Data2D<int> *)local_140,(this->super_BaseCanonicalGrid).num_dimensions,iVar3);
        for (v._4_4_ = 0; v._4_4_ < iVar3; v._4_4_ = v._4_4_ + 1) {
          __first = StorageSet::getValues(&(this->super_BaseCanonicalGrid).values,piVar6[v._4_4_]);
          direction_grid.gpu_cachef._M_t.
          super___uniq_ptr_impl<TasGrid::CudaWaveletData<float>,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<float>_*,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
          .super__Head_base<0UL,_TasGrid::CudaWaveletData<float>_*,_false>._M_head_impl =
               (__uniq_ptr_data<TasGrid::CudaWaveletData<float>,_std::default_delete<TasGrid::CudaWaveletData<float>_>,_true,_true>
                )Data2D<double>::getStrip
                           ((Data2D<double> *)
                            &indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,v._4_4_);
          if (local_28 == -1) {
            ::std::copy<double_const*,double*>
                      (__first,__first + (this->super_BaseCanonicalGrid).num_outputs,
                       (double *)
                       direction_grid.gpu_cachef._M_t.
                       super___uniq_ptr_impl<TasGrid::CudaWaveletData<float>,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<float>_*,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
                       .super__Head_base<0UL,_TasGrid::CudaWaveletData<float>_*,_false>._M_head_impl
                      );
          }
          else {
            *(double *)
             direction_grid.gpu_cachef._M_t.
             super___uniq_ptr_impl<TasGrid::CudaWaveletData<float>,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<float>_*,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
             .super__Head_base<0UL,_TasGrid::CudaWaveletData<float>_*,_false>._M_head_impl =
                 __first[local_28];
          }
          piVar7 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,piVar6[v._4_4_]);
          iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
          __result = Data2D<int>::getStrip((Data2D<int> *)local_140,v._4_4_);
          ::std::copy_n<int_const*,int,int*>(piVar7,iVar1,__result);
        }
        acc = (this->super_BaseCanonicalGrid).acceleration;
        iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
        Data2D<int>::release
                  ((vector<int,_std::allocator<int>_> *)local_388,(Data2D<int> *)local_140);
        MultiIndexSet::MultiIndexSet
                  (&local_370,(long)iVar1,(vector<int,_std::allocator<int>_> *)local_388);
        GridWavelet((GridWavelet *)local_348,acc,&local_370,local_414,this->order,
                    (Data2D<double> *)
                    &indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        MultiIndexSet::~MultiIndexSet(&local_370);
        ::std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_388);
        for (coeff._4_4_ = 0; coeff._4_4_ < iVar3; coeff._4_4_ = coeff._4_4_ + 1) {
          bVar2 = true;
          Data2D<double>::getStrip((Data2D<double> *)&direction_grid.order,coeff._4_4_);
          pDVar8 = &this->coefficients;
          Data2D<double>::getStrip(pDVar8,piVar6[coeff._4_4_]);
          if (local_28 == -1) {
            for (local_3a4 = 0; local_3a4 < (this->super_BaseCanonicalGrid).num_outputs;
                local_3a4 = local_3a4 + 1) {
              if (bVar2) {
                ::std::abs((int)pDVar8);
                pDVar8 = (Data2D<double> *)local_78;
                pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)pDVar8,
                                    (long)local_3a4);
                if (_output_local <
                    (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) / *pvVar5) {
                  ::std::abs((int)pDVar8);
                  pDVar8 = (Data2D<double> *)local_78;
                  pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)pDVar8,
                                      (long)local_3a4);
                  if (_output_local <
                      (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02) / *pvVar5) {
                    bVar2 = false;
                  }
                }
              }
            }
          }
          else {
            ::std::abs((int)pDVar8);
            this_00 = (vector<double,_std::allocator<double>_> *)local_78;
            pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                               (this_00,(long)local_28);
            if (_output_local < (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03) / *pvVar5)
            {
              ::std::abs((int)this_00);
              pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)local_78,(long)local_28
                                 );
              if (_output_local <
                  (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04) / *pvVar5) {
                bVar2 = false;
              }
            }
          }
          piVar7 = Data2D<int>::getStrip(__return_storage_ptr__,piVar6[coeff._4_4_]);
          piVar7[iVar4] = (uint)(byte)~bVar2;
        }
        ~GridWavelet((GridWavelet *)local_348);
        Data2D<int>::~Data2D((Data2D<int> *)local_140);
        Data2D<double>::~Data2D
                  ((Data2D<double> *)
                   &indexes.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections((SplitDirections *)&d);
    }
    local_2d = 1;
    norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_78);
  }
  else {
    local_2d = 1;
    norm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  if ((local_2d & 1) == 0) {
    Data2D<int>::~Data2D(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridWavelet::buildUpdateMap(double tolerance, TypeRefinement criteria, int output) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        // classic refinement
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = coefficients.getStrip(i);
            if (output == -1){
                for(size_t k=0; k<((size_t) num_outputs); k++){
                    if (small && ((std::abs(s[k]) / norm[k]) > tolerance)) small = false;
                }
            }else{
                small = !((std::abs(s[output]) / norm[output]) > tolerance);
            }
            if (!small){
                int *p = pmap.getStrip(i);
                std::fill(p, p + num_dimensions, 1);
            }
        }
    }else{
        HierarchyManipulations::SplitDirections split(points);

        for(int s=0; s<split.getNumJobs(); s++){
            int d = split.getJobDirection(s);
            int nump = split.getJobNumPoints(s);
            const int *pnts = split.getJobPoints(s);

            int active_outputs = (output == -1) ? num_outputs : 1;

            Data2D<double> vals(active_outputs, nump);
            Data2D<int> indexes(num_dimensions, nump);

            for(int i=0; i<nump; i++){
                const double* v = values.getValues(pnts[i]);
                double *vls = vals.getStrip(i);
                if (output == -1){
                    std::copy(v, v + num_outputs, vls);
                }else{
                    vls[0] = v[output];
                }
                std::copy_n(points.getIndex(pnts[i]), num_dimensions, indexes.getStrip(i));
            }

            GridWavelet direction_grid(acceleration, {(size_t) num_dimensions, indexes.release()}, active_outputs, order, std::move(vals));

            for(int i=0; i<nump; i++){
                bool small = true;
                const double *coeff = direction_grid.coefficients.getStrip(i);
                const double *soeff = coefficients.getStrip(pnts[i]);
                if (output == -1){
                    for(int k=0; k<num_outputs; k++){
                        if (small && ((std::abs(soeff[k]) / norm[k]) > tolerance) && ((std::abs(coeff[k]) / norm[k]) > tolerance)) small = false;
                    }
                }else{
                    if (((std::abs(soeff[output]) / norm[output]) > tolerance) && ((std::abs(coeff[0]) / norm[output]) > tolerance)) small = false;
                }
                pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;
            }
        }
    }
    return pmap;
}